

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-emscripten.cpp
# Opt level: O2

string * wasm::escape(string *__return_storage_ptr__,string *code)

{
  ulong uVar1;
  
  while (uVar1 = std::__cxx11::string::find((char *)code,0xe57072), uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)code,uVar1,(char *)0x2);
    std::__cxx11::string::_M_assign((string *)code);
  }
  while (uVar1 = std::__cxx11::string::find((char *)code,0xe57076), uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)code,uVar1,(char *)0x2);
    std::__cxx11::string::_M_assign((string *)code);
  }
  while ((uVar1 = std::__cxx11::string::find((char)code,0x22), uVar1 == 0 ||
         (uVar1 != 0xffffffffffffffff))) {
    std::__cxx11::string::replace((ulong)code,uVar1,(char *)0x1);
    std::__cxx11::string::_M_assign((string *)code);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)code);
  return __return_storage_ptr__;
}

Assistant:

std::string escape(std::string code) {
  // replace newlines quotes with escaped newlines
  size_t curr = 0;
  while ((curr = code.find("\\n", curr)) != std::string::npos) {
    code = code.replace(curr, 2, "\\\\n");
    curr += 3; // skip this one
  }
  curr = 0;
  while ((curr = code.find("\\t", curr)) != std::string::npos) {
    code = code.replace(curr, 2, "\\\\t");
    curr += 3; // skip this one
  }
  // replace double quotes with escaped single quotes
  curr = 0;
  while ((curr = code.find('"', curr)) != std::string::npos) {
    if (curr == 0 || code[curr - 1] != '\\') {
      code = code.replace(curr,
                          1,
                          "\\"
                          "\"");
      curr += 2; // skip this one
    } else {     // already escaped, escape the slash as well
      code = code.replace(curr,
                          1,
                          "\\"
                          "\\"
                          "\"");
      curr += 3; // skip this one
    }
  }
  return code;
}